

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O1

int match(char *pat,char *str)

{
  int iVar1;
  size_t sVar2;
  char *__needle;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  char Xbuf [128];
  int local_d4;
  char *local_d0;
  char local_b8 [136];
  
  if (*pat == '\0') {
    local_d0 = (char *)0x0;
    uVar4 = 0;
  }
  else {
    local_d4 = 0x7f;
    local_d0 = (char *)0x0;
    __needle = local_b8;
    iVar5 = 0;
    pcVar3 = pat;
    do {
      sVar2 = strcspn(pcVar3,",|");
      iVar6 = (int)sVar2;
      if (local_d4 < iVar6) {
        local_d4 = iVar6 + 0x80;
        __needle = (char *)realloc(local_d0,(ulong)(iVar6 + 0x81));
        local_d0 = __needle;
      }
      memcpy(__needle,pcVar3,(long)iVar6);
      __needle[iVar6] = '\0';
      if ((iVar6 < 1) || (__needle[iVar6 - 1] != '$')) {
        pcVar3 = strstr(str,__needle);
        bVar7 = pcVar3 != (char *)0x0;
      }
      else {
        sVar2 = strlen(str);
        uVar4 = iVar6 - 1;
        __needle[uVar4] = '\0';
        if ((int)sVar2 < (int)uVar4) {
          bVar7 = false;
        }
        else {
          iVar1 = strcmp(str + (int)((int)sVar2 - uVar4),__needle);
          bVar7 = iVar1 == 0;
        }
      }
      if (bVar7 != false) break;
      sVar2 = strspn(pat + (iVar5 + iVar6),",|");
      iVar5 = iVar5 + iVar6 + (int)sVar2;
      pcVar3 = pat + iVar5;
    } while (pat[iVar5] != '\0');
    uVar4 = (uint)bVar7;
  }
  free(local_d0);
  return uVar4;
}

Assistant:

static int match (const char *pat, const char *str) {
	static const char seps[] = ",|";
	int found = 0;
	char Xbuf[128];
	int m = sizeof (Xbuf) - 1;
	char *mbuf = NULL;
	char *buf = Xbuf;
	int i = 0;
	while (!found && pat[i] != '\0') {
		int blen = strcspn (&pat[i], seps);
		int e = i + blen;
		if (blen > m) {
			m = blen + 128;
			buf = mbuf = (char *) realloc (mbuf, m + 1);
		}
		memcpy (buf, &pat[i], blen);
		buf[blen] = '\0';
		if (blen > 0 && buf[blen - 1] == '$') {
			int slen = strlen (str);
			buf[--blen] = 0;
			found = (slen >= blen &&
				 strcmp (&str[slen-blen], buf) == 0);
		} else {
			found = (strstr (str, buf) != NULL);
		}
		i = e + strspn (&pat[e], seps);
	}
	free (mbuf);
	return (found);
}